

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O3

vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
* __thiscall
happly::Element::getDataFromListPropertyRecursive<unsigned_long,int>
          (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *__return_storage_ptr__,Element *this,Property *prop)

{
  int *piVar1;
  long lVar2;
  Tcan *v;
  int *piVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> castedFlatVecCopy;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  unsigned_long local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  if ((prop == (Property *)0x0) ||
     (lVar2 = __dynamic_cast(prop,&Property::typeinfo,&TypedListProperty<int>::typeinfo,0),
     lVar2 == 0)) {
    getDataFromListPropertyRecursive<unsigned_long,short>(__return_storage_ptr__,this,prop);
    return __return_storage_ptr__;
  }
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  geometrycentral::surface::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
             *(long *)(lVar2 + 0x30) - *(long *)(lVar2 + 0x28) >> 2);
  piVar3 = *(int **)(lVar2 + 0x28);
  piVar1 = *(int **)(lVar2 + 0x30);
  if (piVar3 != piVar1) {
    do {
      local_50 = (unsigned_long)*piVar3;
      if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_50);
      }
      else {
        *local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_50;
        local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      piVar3 = piVar3 + 1;
    } while (piVar3 != piVar1);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(lVar2 + 0x40));
  anon_unknown_3::unflattenList<unsigned_long>(__return_storage_ptr__,&local_68,&local_48);
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    return __return_storage_ptr__;
  }
  operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<D>> getDataFromListPropertyRecursive(Property* prop) {
    typedef typename CanonicalName<T>::type Tcan;

    TypedListProperty<Tcan>* castedProp = dynamic_cast<TypedListProperty<Tcan>*>(prop);
    if (castedProp) {
      // Succeeded, return a buffer of the data (copy while converting type)

      // Convert to flat buffer of new type
      std::vector<D>* castedFlatVec = nullptr;
      std::vector<D> castedFlatVecCopy; // we _might_ make a copy here, depending on is_same below

      if (std::is_same<std::vector<D>, std::vector<Tcan>>::value) {
        // just use the array we already have
        castedFlatVec = addressIfSame<std::vector<D>>(castedProp->flattenedData, 0 /* dummy arg to disambiguate */);
      } else {
        // make a copy
        castedFlatVecCopy.reserve(castedProp->flattenedData.size());
        for (Tcan& v : castedProp->flattenedData) {
          castedFlatVecCopy.push_back(static_cast<D>(v));
        }
        castedFlatVec = &castedFlatVecCopy;
      }

      // Unflatten and return
      return unflattenList(*castedFlatVec, castedProp->flattenedIndexStart);
    }

    TypeChain<Tcan> chainType;
    if (chainType.hasChildType) {
      return getDataFromListPropertyRecursive<D, typename TypeChain<Tcan>::type>(prop);
    } else {
      // No smaller type to try, failure
      throw std::runtime_error("PLY parser: list property " + prop->name +
                               " cannot be coerced to requested type list " + typeName<D>() + ". Has type list " +
                               prop->propertyTypeName());
    }
  }